

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPhotons.test.cpp
# Opt level: O2

void verifyChunk(ContinuousPhotons *chunk)

{
  long lVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  double local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x6e;
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "2 == chunk.LO()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d0,capturedExpression,
             ContinueOnFailure);
  local_c8._0_2_ = 0x101;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x6f;
  capturedExpression_00.m_size = 0x1b;
  capturedExpression_00.m_start = "2 == chunk.representation()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d0,capturedExpression_00,
             ContinueOnFailure);
  local_c8._0_2_ = 0x101;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x70;
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "0 == chunk.NG()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d0,capturedExpression_01,
             ContinueOnFailure);
  local_c8._0_2_ = 0x101;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x71;
  capturedExpression_02.m_size = 0x22;
  capturedExpression_02.m_start = "0 == chunk.numberDiscretePhotons()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d0,capturedExpression_02,
             ContinueOnFailure);
  local_c8._0_2_ = 0x101;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ = 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x72;
  capturedExpression_03.m_size = 0x10;
  capturedExpression_03.m_start = "6 == chunk.NNF()";
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d0,capturedExpression_03,
             ContinueOnFailure);
  local_b8[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(chunk->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_c8._1_1_ = local_b8[0]._8_4_ == 6;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8._4_4_ = 6;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x73;
  capturedExpression_04.m_size = 0x1d;
  capturedExpression_04.m_start = "6 == chunk.numberPrecursors()";
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d0,capturedExpression_04,
             ContinueOnFailure);
  local_b8[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(chunk->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_c8._1_1_ = local_b8[0]._8_4_ == 6;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3330;
  local_c8._4_4_ = 6;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x75;
  capturedExpression_05.m_size = 0x1b;
  capturedExpression_05.m_start = "6 == chunk.lambdas().size()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d0,capturedExpression_05,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x30;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3370;
  local_c8._4_4_ = 6;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x76;
  capturedExpression_06.m_size = 0x22;
  capturedExpression_06.m_start = "6 == chunk.decayConstants().size()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d0,capturedExpression_06,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x30;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c3370;
  local_c8._4_4_ = 6;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x77;
  capturedExpression_07.m_size = 0x29;
  capturedExpression_07.m_start = "0.013336, WithinRel( chunk.lambdas()[0] )";
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d0,capturedExpression_07,
             ContinueOnFailure);
  local_d8 = 0.013336;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x78;
  capturedExpression_08.m_size = 0x29;
  capturedExpression_08.m_start = "0.032739, WithinRel( chunk.lambdas()[1] )";
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d0,capturedExpression_08,
             ContinueOnFailure);
  local_d8 = 0.032739;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x79;
  capturedExpression_09.m_size = 0x28;
  capturedExpression_09.m_start = "0.12078, WithinRel( chunk.lambdas()[2] )";
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d0,capturedExpression_09,
             ContinueOnFailure);
  local_d8 = 0.12078;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7a;
  capturedExpression_10.m_size = 0x28;
  capturedExpression_10.m_start = "0.30278, WithinRel( chunk.lambdas()[3] )";
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_d0,capturedExpression_10,
             ContinueOnFailure);
  local_d8 = 0.30278;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7b;
  capturedExpression_11.m_size = 0x28;
  capturedExpression_11.m_start = "0.84949, WithinRel( chunk.lambdas()[4] )";
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_d0,capturedExpression_11,
             ContinueOnFailure);
  local_d8 = 0.84949;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7c;
  capturedExpression_12.m_size = 0x29;
  capturedExpression_12.m_start = "2.853000, WithinRel( chunk.lambdas()[5] )";
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_d0,capturedExpression_12,
             ContinueOnFailure);
  local_d8 = 2.853;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7d;
  capturedExpression_13.m_size = 0x30;
  capturedExpression_13.m_start = "0.013336, WithinRel( chunk.decayConstants()[0] )";
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_d0,capturedExpression_13,
             ContinueOnFailure);
  local_d8 = 0.013336;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7e;
  capturedExpression_14.m_size = 0x30;
  capturedExpression_14.m_start = "0.032739, WithinRel( chunk.decayConstants()[1] )";
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_d0,capturedExpression_14,
             ContinueOnFailure);
  local_d8 = 0.032739;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x7f;
  capturedExpression_15.m_size = 0x2f;
  capturedExpression_15.m_start = "0.12078, WithinRel( chunk.decayConstants()[2] )";
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_d0,capturedExpression_15,
             ContinueOnFailure);
  local_d8 = 0.12078;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x80;
  capturedExpression_16.m_size = 0x2f;
  capturedExpression_16.m_start = "0.30278, WithinRel( chunk.decayConstants()[3] )";
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_d0,capturedExpression_16,
             ContinueOnFailure);
  local_d8 = 0.30278;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x81;
  capturedExpression_17.m_size = 0x2f;
  capturedExpression_17.m_start = "0.84949, WithinRel( chunk.decayConstants()[4] )";
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_d0,capturedExpression_17,
             ContinueOnFailure);
  local_d8 = 0.84949;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x82;
  capturedExpression_18.m_size = 0x30;
  capturedExpression_18.m_start = "2.853000, WithinRel( chunk.decayConstants()[5] )";
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_d0,capturedExpression_18,
             ContinueOnFailure);
  local_d8 = 2.853;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c33b0;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x17a45c;
  local_c8 = (pointer)0x84;
  capturedExpression_19.m_size = 0xf;
  capturedExpression_19.m_start = "2 == chunk.NC()";
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_d0,capturedExpression_19,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_c8._1_1_ = local_b8[0]._8_8_ == 2;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c33f0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ContinuousPhotons& chunk ) {

  CHECK( 2 == chunk.LO() );
  CHECK( 2 == chunk.representation() );
  CHECK( 0 == chunk.NG() );
  CHECK( 0 == chunk.numberDiscretePhotons() );
  CHECK( 6 == chunk.NNF() );
  CHECK( 6 == chunk.numberPrecursors() );

  CHECK( 6 == chunk.lambdas().size() );
  CHECK( 6 == chunk.decayConstants().size() );
  CHECK_THAT( 0.013336, WithinRel( chunk.lambdas()[0] ) );
  CHECK_THAT( 0.032739, WithinRel( chunk.lambdas()[1] ) );
  CHECK_THAT( 0.12078, WithinRel( chunk.lambdas()[2] ) );
  CHECK_THAT( 0.30278, WithinRel( chunk.lambdas()[3] ) );
  CHECK_THAT( 0.84949, WithinRel( chunk.lambdas()[4] ) );
  CHECK_THAT( 2.853000, WithinRel( chunk.lambdas()[5] ) );
  CHECK_THAT( 0.013336, WithinRel( chunk.decayConstants()[0] ) );
  CHECK_THAT( 0.032739, WithinRel( chunk.decayConstants()[1] ) );
  CHECK_THAT( 0.12078, WithinRel( chunk.decayConstants()[2] ) );
  CHECK_THAT( 0.30278, WithinRel( chunk.decayConstants()[3] ) );
  CHECK_THAT( 0.84949, WithinRel( chunk.decayConstants()[4] ) );
  CHECK_THAT( 2.853000, WithinRel( chunk.decayConstants()[5] ) );

  CHECK( 2 == chunk.NC() );
}